

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O2

int spvtools::assumedBitWidth(IdType *type)

{
  if (type->type_class - kScalarIntegerType < 2) {
    return type->bitwidth;
  }
  if (type->type_class == kBottom) {
    return 0x20;
  }
  return 0;
}

Assistant:

inline int assumedBitWidth(const IdType& type) {
  switch (type.type_class) {
    case IdTypeClass::kBottom:
      return 32;
    case IdTypeClass::kScalarIntegerType:
    case IdTypeClass::kScalarFloatType:
      return type.bitwidth;
    default:
      break;
  }
  // We don't care about this case.
  return 0;
}